

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase * EvaluateGetAddress(ExpressionEvalContext *ctx,ExprGetAddress *expression)

{
  bool bVar1;
  StackFrame **ppSVar2;
  ExprBase *this;
  ExprPointerLiteral *value;
  ExprPointerLiteral *ptr;
  ExprGetAddress *expression_local;
  ExpressionEvalContext *ctx_local;
  
  bVar1 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::empty(&ctx->stackFrames);
  if ((!bVar1) &&
     (ppSVar2 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames),
     (*ppSVar2)->targetYield != 0)) {
    this = &ExpressionContext::get<ExprVoid>(ctx->ctx)->super_ExprBase;
    ExprVoid::ExprVoid((ExprVoid *)this,(expression->super_ExprBase).source,ctx->ctx->typeVoid);
    return this;
  }
  bVar1 = AddInstruction(ctx);
  if (bVar1) {
    value = FindVariableStorage(ctx,expression->variable->variable,false);
    if (value == (ExprPointerLiteral *)0x0) {
      ctx_local = (ExpressionEvalContext *)0x0;
    }
    else {
      ctx_local = (ExpressionEvalContext *)
                  CheckType(&expression->super_ExprBase,&value->super_ExprBase);
    }
  }
  else {
    ctx_local = (ExpressionEvalContext *)0x0;
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* EvaluateGetAddress(ExpressionEvalContext &ctx, ExprGetAddress *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprPointerLiteral *ptr = FindVariableStorage(ctx, expression->variable->variable, false);

	if(!ptr)
		return NULL;

	return CheckType(expression, ptr);
}